

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Slice_x86_avx::forward
          (Slice_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  unsigned_long *puVar5;
  int *piVar6;
  float *pfVar7;
  size_t sVar8;
  Allocator *pAVar9;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  float *outptr_5;
  Mat *top_blob_10;
  size_t i_12;
  int j_10;
  float *ptr_5;
  int p_2;
  Mat *top_blob_9;
  int slice_5;
  size_t i_11;
  int q_8;
  int channels_2;
  int h_4;
  int w_5;
  float *outptr_4;
  int size_5;
  Mat *top_blob_8;
  size_t i_10;
  float *ptr_4;
  int p_1;
  Mat *top_blob_7;
  int slice_4;
  size_t i_9;
  int q_7;
  int channels_1;
  int h_3;
  int w_4;
  float *outptr_3;
  float *ptr_3;
  int size_4;
  int j_9;
  float *outptr0_5;
  float *r3_3;
  float *r2_3;
  float *r1_5;
  float *r0_5;
  int q_6;
  int size_3;
  int j_8;
  float *outptr0_4;
  float *r7_1;
  float *r6_1;
  float *r5_1;
  float *r4_1;
  float *r3_2;
  float *r2_2;
  float *r1_4;
  float *r0_4;
  int q_5;
  int size_2;
  int j_7;
  float *outptr0_3;
  float *r1_3;
  float *r0_3;
  int q_4;
  int size_1;
  Mat *top_blob_6;
  size_t i_8;
  int p;
  Mat bottom_blob_unpacked_1;
  size_t i_7;
  int out_elempack_3;
  size_t out_elemsize_3;
  Mat *top_blob_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int slice_3;
  size_t i_6;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  float *outptr_2;
  Mat *top_blob_4;
  size_t i_5;
  float *ptr_2;
  int j_6;
  Mat *top_blob_3;
  int slice_2;
  size_t i_4;
  int q_2;
  int h_1;
  int w_2;
  float *outptr_1;
  int size;
  int j_5;
  float *outptr0_2;
  float *r3_1;
  float *r2_1;
  float *r1_2;
  float *r0_2;
  int j_4;
  int j_3;
  float *outptr0_1;
  float *r7;
  float *r6;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1_1;
  float *r0_1;
  int j_2;
  int j_1;
  float *outptr0;
  float *r1;
  float *r0;
  int j;
  Mat *top_blob_2;
  size_t i_3;
  float *ptr_1;
  Mat bottom_blob_unpacked;
  size_t i_2;
  int out_elempack_1;
  size_t out_elemsize_1;
  Mat *top_blob_1;
  size_t out_elemsize_2;
  int out_elempack_2;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  float *outptr;
  float *ptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  int elempack;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff398;
  Mat *in_stack_fffffffffffff3a0;
  Mat *pMVar10;
  size_t in_stack_fffffffffffff3a8;
  size_t in_stack_fffffffffffff3b0;
  ulong uVar11;
  undefined8 in_stack_fffffffffffff3b8;
  Mat *in_stack_fffffffffffff3c0;
  Mat *in_stack_fffffffffffff3c8;
  Allocator *in_stack_fffffffffffff3d0;
  Allocator *_allocator;
  Mat *in_stack_fffffffffffff3d8;
  Mat *in_stack_fffffffffffff3e0;
  int local_b3c;
  int local_ad4;
  int local_abc;
  int local_aa4;
  Mat local_a98;
  float *local_a50;
  reference local_a48;
  ulong local_a40;
  int local_a34;
  Mat local_a30;
  Mat *local_9e8;
  int local_9dc;
  reference local_9d8;
  int local_9cc;
  Allocator *local_9c8;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  Mat local_9b0;
  float *local_968;
  int local_95c;
  reference local_958;
  ulong local_950;
  Mat local_948;
  float *local_900;
  int local_8f4;
  reference local_8f0;
  int local_8e4;
  ulong local_8e0;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  float *local_8c8;
  Mat local_8c0;
  float *local_878;
  int local_870;
  int local_86c;
  Mat local_868;
  float *local_820;
  Mat local_818;
  float *local_7d0;
  Mat local_7c8;
  float *local_780;
  Mat local_778;
  float *local_730;
  Mat local_728;
  float *local_6e0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  Mat local_6c8;
  float *local_680;
  Mat local_678;
  float *local_630;
  Mat local_628;
  float *local_5e0;
  Mat local_5d8;
  float *local_590;
  Mat local_588;
  float *local_540;
  Mat local_538;
  float *local_4f0;
  Mat local_4e8;
  float *local_4a0;
  Mat local_498;
  float *local_450;
  Mat local_448;
  float *local_400;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  Mat local_3e8;
  float *local_3a0;
  Mat local_398;
  float *local_350;
  Mat local_348;
  float *local_300;
  int local_2f8;
  int local_2f4;
  reference local_2f0;
  ulong local_2e8;
  int local_2dc;
  ulong local_290;
  int local_284;
  size_t local_280;
  reference local_278;
  long local_270;
  int local_268;
  int local_264;
  ulong local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  float *local_248;
  reference local_240;
  ulong local_238;
  float *local_230;
  int local_224;
  reference local_220;
  int local_214;
  ulong local_210;
  int local_204;
  int local_200;
  int local_1fc;
  float *local_1f8;
  int local_1f0;
  int local_1ec;
  float *local_1e8;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  int local_1c0;
  int local_1bc;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float *local_198;
  float *local_190;
  float *local_188;
  float *local_180;
  float *local_178;
  int local_170;
  int local_16c;
  float *local_168;
  float *local_160;
  float *local_158;
  int local_14c;
  Mat *local_148;
  ulong local_140;
  float *local_138;
  Mat local_120;
  ulong local_d8;
  int local_cc;
  size_t local_c8;
  reference local_c0;
  long local_b8;
  int local_b0;
  int local_ac;
  ulong local_a8;
  int local_9c;
  int local_98;
  int local_94;
  float *local_90;
  float *local_88;
  reference local_80;
  long local_78;
  int local_70;
  int local_6c;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  int local_44;
  size_t local_40;
  int local_34;
  const_reference local_30;
  long local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->dims;
  local_40 = local_30->elemsize;
  local_44 = local_30->elempack;
  local_50 = ncnn::Mat::operator_cast_to_int_
                       ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118) < 0) {
    local_aa4 = local_34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  else {
    local_aa4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  local_54 = local_aa4;
  if (local_34 == 1) {
    local_58 = local_30->w * local_44;
    local_5c = 0;
    for (local_68 = 0; uVar11 = local_68,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_68 = local_68 + 1) {
      local_6c = local_50[local_68];
      if (local_6c == -0xe9) {
        iVar2 = local_58 - local_5c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_6c = (int)((ulong)(long)iVar2 / (sVar3 - local_68));
      }
      local_70 = 1;
      if ((*(byte *)(local_28 + 0x27) & 1) != 0) {
        if (local_6c % 8 == 0) {
          local_abc = 8;
        }
        else {
          local_abc = 1;
          if (local_6c % 4 == 0) {
            local_abc = 4;
          }
        }
        local_70 = local_abc;
      }
      local_78 = (local_40 / (ulong)(long)local_44) * (long)local_70;
      local_80 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_68);
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        in_stack_fffffffffffff3b0,(int)(in_stack_fffffffffffff3a8 >> 0x20),
                        (Allocator *)in_stack_fffffffffffff3a0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_88 = ncnn::Mat::operator_cast_to_float_(local_30);
      local_88 = local_88 + local_5c;
      local_90 = ncnn::Mat::operator_cast_to_float_(local_80);
      memcpy(local_90,local_88,(long)local_80->w * local_80->elemsize);
      local_5c = local_6c + local_5c;
    }
  }
  if ((local_34 == 2) && (local_54 == 0)) {
    local_94 = local_30->w;
    local_98 = local_30->h * local_44;
    local_9c = 0;
    for (local_a8 = 0; uVar11 = local_a8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_a8 = local_a8 + 1) {
      local_ac = local_50[local_a8];
      if (local_ac == -0xe9) {
        iVar2 = local_98 - local_9c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_ac = (int)((ulong)(long)iVar2 / (sVar3 - local_a8));
      }
      local_b0 = 1;
      if ((*(byte *)(local_28 + 0x27) & 1) != 0) {
        if (local_ac % 8 == 0) {
          local_ad4 = 8;
        }
        else {
          local_ad4 = 1;
          if (local_ac % 4 == 0) {
            local_ad4 = 4;
          }
        }
        local_b0 = local_ad4;
      }
      local_b8 = (local_40 / (ulong)(long)local_44) * (long)local_b0;
      local_c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_a8);
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (int)in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
                        (int)(in_stack_fffffffffffff3a8 >> 0x20),
                        (Allocator *)in_stack_fffffffffffff3a0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_9c = local_ac + local_9c;
    }
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_c8 = pvVar4->elemsize;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_cc = pvVar4->elempack;
    for (local_d8 = 0; uVar11 = local_d8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_d8 = local_d8 + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d8);
      puVar5 = std::min<unsigned_long>(&local_c8,&pvVar4->elemsize);
      local_c8 = *puVar5;
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d8);
      piVar6 = std::min<int>(&local_cc,&pvVar4->elempack);
      local_cc = *piVar6;
    }
    ncnn::Mat::Mat(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
    if (local_cc < local_44) {
      convert_packing(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                      (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                      (Option *)in_stack_fffffffffffff3c8);
    }
    local_138 = ncnn::Mat::operator_cast_to_float_(&local_120);
    for (local_140 = 0; uVar11 = local_140,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_140 = local_140 + 1) {
      local_148 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_140)
      ;
      if ((local_cc == 4) && (local_148->elempack == 8)) {
        for (local_14c = 0; local_14c < local_148->h; local_14c = local_14c + 1) {
          local_158 = local_138;
          local_160 = local_138 + (local_94 << 2);
          local_168 = ncnn::Mat::row(local_148,local_14c);
          for (local_16c = 0; local_16c < local_94; local_16c = local_16c + 1) {
            *local_168 = *local_158;
            local_168[1] = local_158[1];
            local_168[2] = local_158[2];
            local_168[3] = local_158[3];
            local_168[4] = *local_160;
            local_168[5] = local_160[1];
            local_168[6] = local_160[2];
            local_168[7] = local_160[3];
            local_158 = local_158 + 4;
            local_160 = local_160 + 4;
            local_168 = local_168 + 8;
          }
          local_138 = local_138 + (local_94 << 3);
        }
      }
      if ((local_cc == 1) && (local_148->elempack == 8)) {
        for (local_170 = 0; local_170 < local_148->h; local_170 = local_170 + 1) {
          local_178 = local_138;
          local_180 = local_138 + local_94;
          local_188 = local_138 + local_94 * 2;
          local_190 = local_138 + local_94 * 3;
          local_198 = local_138 + (local_94 << 2);
          local_1a0 = local_138 + local_94 * 5;
          local_1a8 = local_138 + local_94 * 6;
          local_1b0 = local_138 + local_94 * 7;
          local_1b8 = ncnn::Mat::row(local_148,local_170);
          for (local_1bc = 0; local_1bc < local_94; local_1bc = local_1bc + 1) {
            *local_1b8 = *local_178;
            local_1b8[1] = *local_180;
            local_1b8[2] = *local_188;
            local_1b8[3] = *local_190;
            local_1b8[4] = *local_198;
            local_1b8[5] = *local_1a0;
            local_1b8[6] = *local_1a8;
            local_1b8[7] = *local_1b0;
            local_1b8 = local_1b8 + 8;
            local_1b0 = local_1b0 + 1;
            local_1a8 = local_1a8 + 1;
            local_1a0 = local_1a0 + 1;
            local_198 = local_198 + 1;
            local_190 = local_190 + 1;
            local_188 = local_188 + 1;
            local_180 = local_180 + 1;
            local_178 = local_178 + 1;
          }
          local_138 = local_138 + (local_94 << 3);
        }
      }
      if ((local_cc == 1) && (local_148->elempack == 4)) {
        for (local_1c0 = 0; local_1c0 < local_148->h; local_1c0 = local_1c0 + 1) {
          local_1c8 = local_138;
          local_1d0 = local_138 + local_94;
          local_1d8 = local_138 + local_94 * 2;
          local_1e0 = local_138 + local_94 * 3;
          local_1e8 = ncnn::Mat::row(local_148,local_1c0);
          for (local_1ec = 0; local_1ec < local_94; local_1ec = local_1ec + 1) {
            *local_1e8 = *local_1c8;
            local_1e8[1] = *local_1d0;
            local_1e8[2] = *local_1d8;
            local_1e8[3] = *local_1e0;
            local_1e8 = local_1e8 + 4;
            local_1e0 = local_1e0 + 1;
            local_1d8 = local_1d8 + 1;
            local_1d0 = local_1d0 + 1;
            local_1c8 = local_1c8 + 1;
          }
          local_138 = local_138 + (local_94 << 2);
        }
      }
      if (local_cc == local_148->elempack) {
        local_1f0 = local_94 * local_148->h;
        local_1f8 = ncnn::Mat::operator_cast_to_float_(local_148);
        memcpy(local_1f8,local_138,(long)local_1f0 * local_148->elemsize);
        local_138 = local_138 + local_1f0 * local_148->elempack;
      }
    }
    ncnn::Mat::~Mat((Mat *)0x50f9fd);
  }
  if ((local_34 == 2) && (local_54 == 1)) {
    local_1fc = local_30->w;
    local_200 = local_30->h;
    local_204 = 0;
    for (local_210 = 0; uVar11 = local_210,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_210 = local_210 + 1) {
      local_214 = local_50[local_210];
      if (local_214 == -0xe9) {
        iVar2 = local_1fc - local_204;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_214 = (int)((ulong)(long)iVar2 / (sVar3 - local_210));
      }
      local_220 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_210)
      ;
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (int)in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
                        (int)(in_stack_fffffffffffff3a8 >> 0x20),
                        (Allocator *)in_stack_fffffffffffff3a0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_204 = local_214 + local_204;
    }
    for (local_224 = 0; local_224 < local_200; local_224 = local_224 + 1) {
      local_230 = ncnn::Mat::row<float_const>(local_30,local_224);
      for (local_238 = 0; uVar11 = local_238,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3
          ; local_238 = local_238 + 1) {
        local_240 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_20,local_238);
        local_248 = ncnn::Mat::row(local_240,local_224);
        memcpy(local_248,local_230,(long)local_240->w * local_40);
        local_230 = local_230 + local_240->w * local_44;
      }
    }
  }
  if ((local_34 == 3) && (local_54 == 0)) {
    local_24c = local_30->w;
    local_250 = local_30->h;
    local_254 = local_30->c * local_44;
    local_258 = 0;
    for (local_260 = 0; uVar11 = local_260,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_260 = local_260 + 1) {
      local_264 = local_50[local_260];
      if (local_264 == -0xe9) {
        iVar2 = local_254 - local_258;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_264 = (int)((ulong)(long)iVar2 / (sVar3 - local_260));
      }
      local_268 = 1;
      if ((*(byte *)(local_28 + 0x27) & 1) != 0) {
        if (local_264 % 8 == 0) {
          local_b3c = 8;
        }
        else {
          local_b3c = 1;
          if (local_264 % 4 == 0) {
            local_b3c = 4;
          }
        }
        local_268 = local_b3c;
      }
      local_270 = (local_40 / (ulong)(long)local_44) * (long)local_268;
      local_278 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_260)
      ;
      in_stack_fffffffffffff398 = *(Mat **)(local_28 + 8);
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (int)in_stack_fffffffffffff3b8,(int)(in_stack_fffffffffffff3b0 >> 0x20),
                        in_stack_fffffffffffff3a8,(int)((ulong)in_stack_fffffffffffff3a0 >> 0x20),
                        in_stack_fffffffffffff3d0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_258 = local_264 + local_258;
    }
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_280 = pvVar4->elemsize;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_284 = pvVar4->elempack;
    for (local_290 = 0; uVar11 = local_290,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_290 = local_290 + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_290);
      puVar5 = std::min<unsigned_long>(&local_280,&pvVar4->elemsize);
      local_280 = *puVar5;
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_290);
      piVar6 = std::min<int>(&local_284,&pvVar4->elempack);
      local_284 = *piVar6;
    }
    ncnn::Mat::Mat(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
    if (local_284 < local_44) {
      convert_packing(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                      (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                      (Option *)in_stack_fffffffffffff3c8);
    }
    local_2dc = 0;
    for (local_2e8 = 0; uVar11 = local_2e8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_2e8 = local_2e8 + 1) {
      local_2f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_2e8)
      ;
      if ((local_284 == 4) && (local_2f0->elempack == 8)) {
        local_2f4 = local_2f0->w * local_2f0->h;
        for (local_2f8 = 0; local_2f8 < local_2f0->c; local_2f8 = local_2f8 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_348);
          ncnn::Mat::~Mat((Mat *)0x51019b);
          local_300 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_398);
          ncnn::Mat::~Mat((Mat *)0x5101ef);
          local_350 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_3e8);
          ncnn::Mat::~Mat((Mat *)0x510241);
          local_3a0 = pfVar7;
          for (local_3ec = 0; local_3ec < local_2f4; local_3ec = local_3ec + 1) {
            *local_3a0 = *local_300;
            local_3a0[1] = local_300[1];
            local_3a0[2] = local_300[2];
            local_3a0[3] = local_300[3];
            local_3a0[4] = *local_350;
            local_3a0[5] = local_350[1];
            local_3a0[6] = local_350[2];
            local_3a0[7] = local_350[3];
            local_300 = local_300 + 4;
            local_350 = local_350 + 4;
            local_3a0 = local_3a0 + 8;
          }
          local_2dc = local_2dc + 2;
        }
      }
      if ((local_284 == 1) && (local_2f0->elempack == 8)) {
        local_3f0 = local_2f0->w * local_2f0->h;
        for (local_3f4 = 0; local_3f4 < local_2f0->c; local_3f4 = local_3f4 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_448);
          ncnn::Mat::~Mat((Mat *)0x5104cd);
          local_400 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_498);
          ncnn::Mat::~Mat((Mat *)0x510521);
          local_450 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_4e8);
          ncnn::Mat::~Mat((Mat *)0x510576);
          local_4a0 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_538);
          ncnn::Mat::~Mat((Mat *)0x5105cb);
          local_4f0 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_588);
          ncnn::Mat::~Mat((Mat *)0x510620);
          local_540 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_5d8);
          ncnn::Mat::~Mat((Mat *)0x510675);
          local_590 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_628);
          ncnn::Mat::~Mat((Mat *)0x5106ca);
          local_5e0 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_678);
          ncnn::Mat::~Mat((Mat *)0x51071f);
          local_630 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_6c8);
          ncnn::Mat::~Mat((Mat *)0x510771);
          local_680 = pfVar7;
          for (local_6cc = 0; local_6cc < local_3f0; local_6cc = local_6cc + 1) {
            *local_680 = *local_400;
            local_680[1] = *local_450;
            local_680[2] = *local_4a0;
            local_680[3] = *local_4f0;
            local_680[4] = *local_540;
            local_680[5] = *local_590;
            local_680[6] = *local_5e0;
            local_680[7] = *local_630;
            local_680 = local_680 + 8;
            local_630 = local_630 + 1;
            local_5e0 = local_5e0 + 1;
            local_590 = local_590 + 1;
            local_540 = local_540 + 1;
            local_4f0 = local_4f0 + 1;
            local_4a0 = local_4a0 + 1;
            local_450 = local_450 + 1;
            local_400 = local_400 + 1;
          }
          local_2dc = local_2dc + 8;
        }
      }
      if ((local_284 == 1) && (local_2f0->elempack == 4)) {
        local_6d0 = local_2f0->w * local_2f0->h;
        for (local_6d4 = 0; local_6d4 < local_2f0->c; local_6d4 = local_6d4 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_728);
          ncnn::Mat::~Mat((Mat *)0x510b2b);
          local_6e0 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_778);
          ncnn::Mat::~Mat((Mat *)0x510b7f);
          local_730 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_7c8);
          ncnn::Mat::~Mat((Mat *)0x510bd4);
          local_780 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_818);
          ncnn::Mat::~Mat((Mat *)0x510c29);
          local_7d0 = pfVar7;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_868);
          ncnn::Mat::~Mat((Mat *)0x510c7b);
          local_820 = pfVar7;
          for (local_86c = 0; local_86c < local_6d0; local_86c = local_86c + 1) {
            *local_820 = *local_6e0;
            local_820[1] = *local_730;
            local_820[2] = *local_780;
            local_820[3] = *local_7d0;
            local_820 = local_820 + 4;
            local_7d0 = local_7d0 + 1;
            local_780 = local_780 + 1;
            local_730 = local_730 + 1;
            local_6e0 = local_6e0 + 1;
          }
          local_2dc = local_2dc + 4;
        }
      }
      if (local_284 == local_2f0->elempack) {
        sVar8 = ncnn::Mat::total(local_2f0);
        local_870 = (int)sVar8;
        ncnn::Mat::channel(in_stack_fffffffffffff3c8,(int)((ulong)in_stack_fffffffffffff3c0 >> 0x20)
                          );
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_8c0);
        ncnn::Mat::~Mat((Mat *)0x510eda);
        local_878 = pfVar7;
        local_8c8 = ncnn::Mat::operator_cast_to_float_(local_2f0);
        memcpy(local_8c8,local_878,(long)local_870 * local_2f0->elemsize);
        local_2dc = local_2f0->c + local_2dc;
      }
    }
    ncnn::Mat::~Mat((Mat *)0x510f9b);
  }
  if ((local_34 == 3) && (local_54 == 1)) {
    local_8cc = local_30->w;
    local_8d0 = local_30->h;
    local_8d4 = local_30->c;
    local_8d8 = 0;
    for (local_8e0 = 0; uVar11 = local_8e0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_8e0 = local_8e0 + 1) {
      local_8e4 = local_50[local_8e0];
      if (local_8e4 == -0xe9) {
        iVar2 = local_8d0 - local_8d8;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_8e4 = (int)((ulong)(long)iVar2 / (sVar3 - local_8e0));
      }
      local_8f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_8e0)
      ;
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (int)in_stack_fffffffffffff3b8,(int)(in_stack_fffffffffffff3b0 >> 0x20),
                        in_stack_fffffffffffff3a8,(int)((ulong)in_stack_fffffffffffff3a0 >> 0x20),
                        in_stack_fffffffffffff3d0);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_8d8 = local_8e4 + local_8d8;
    }
    for (local_8f4 = 0; local_8f4 < local_8d4; local_8f4 = local_8f4 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff3c8,(int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
      pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_948);
      ncnn::Mat::~Mat((Mat *)0x5111b6);
      local_900 = pfVar7;
      for (local_950 = 0; uVar11 = local_950,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3
          ; local_950 = local_950 + 1) {
        local_958 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_20,local_950);
        local_95c = local_958->w * local_958->h;
        pMVar10 = &local_9b0;
        ncnn::Mat::channel(in_stack_fffffffffffff3c8,(int)((ulong)in_stack_fffffffffffff3c0 >> 0x20)
                          );
        pfVar7 = ncnn::Mat::operator_cast_to_float_(pMVar10);
        ncnn::Mat::~Mat((Mat *)0x51126e);
        local_968 = pfVar7;
        memcpy(pfVar7,local_900,(long)local_95c * local_40);
        local_900 = local_900 + local_95c * local_44;
      }
    }
  }
  if ((local_34 == 3) && (local_54 == 2)) {
    local_9b4 = local_30->w;
    local_9b8 = local_30->h;
    local_9bc = local_30->c;
    local_9c0 = 0;
    local_9c8 = (Allocator *)0x0;
    while (_allocator = local_9c8,
          pAVar9 = (Allocator *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20),
          _allocator < pAVar9) {
      local_9cc = local_50[(long)local_9c8];
      if (local_9cc == -0xe9) {
        in_stack_fffffffffffff3c8 = (Mat *)(long)(local_9b4 - local_9c0);
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_9cc = (int)((ulong)in_stack_fffffffffffff3c8 / (sVar3 - (long)local_9c8));
      }
      local_9d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_20,(size_type)local_9c8);
      ncnn::Mat::create(in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (int)in_stack_fffffffffffff3b8,(int)(in_stack_fffffffffffff3b0 >> 0x20),
                        in_stack_fffffffffffff3a8,(int)((ulong)in_stack_fffffffffffff3a0 >> 0x20),
                        _allocator);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff3a0);
      if (bVar1) {
        return -100;
      }
      local_9c0 = local_9cc + local_9c0;
      local_9c8 = (Allocator *)((long)&local_9c8->_vptr_Allocator + 1);
    }
    for (local_9dc = 0; local_9dc < local_9bc; local_9dc = local_9dc + 1) {
      pMVar10 = &local_a30;
      ncnn::Mat::channel(in_stack_fffffffffffff3c8,(int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
      in_stack_fffffffffffff3c0 = (Mat *)ncnn::Mat::operator_cast_to_float_(pMVar10);
      ncnn::Mat::~Mat((Mat *)0x511550);
      local_9e8 = in_stack_fffffffffffff3c0;
      for (local_a34 = 0; local_a34 < local_9b8; local_a34 = local_a34 + 1) {
        local_a40 = 0;
        while (uVar11 = local_a40,
              sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20),
              uVar11 < sVar3) {
          local_a48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_20,local_a40);
          pMVar10 = &local_a98;
          ncnn::Mat::channel(in_stack_fffffffffffff3c8,
                             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
          pfVar7 = ncnn::Mat::row(pMVar10,local_a34);
          ncnn::Mat::~Mat((Mat *)0x511616);
          local_a50 = pfVar7;
          memcpy(pfVar7,local_9e8,(long)local_a48->w * local_40);
          local_9e8 = (Mat *)((long)&local_9e8->data + (long)(local_a48->w * local_44) * 4);
          local_a40 = local_a40 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}